

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O1

void __thiscall OpenMD::SimCreator::computeStorageLayouts(SimCreator *this,SimInfo *info)

{
  int iVar1;
  Globals *pGVar2;
  RNEMDParameters *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  PolarizableAdapter pa;
  SuttonChenAdapter sca;
  EAMAdapter ea;
  DirectionalAdapter da;
  AtomTypeSet atomTypes;
  MultipoleAdapter local_a8;
  SimInfo *local_a0;
  _Rb_tree_node_base *local_98;
  FluctuatingChargeAdapter local_90;
  FixedChargeAdapter local_88;
  PolarizableAdapter local_80;
  SuttonChenAdapter local_78;
  EAMAdapter local_70;
  DirectionalAdapter local_68;
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_60;
  
  pGVar2 = info->simParams_;
  iVar1 = info->nGlobalRigidBodies_;
  SimInfo::getSimulatedAtomTypes((AtomTypeSet *)&local_60,info);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_60._M_impl.super__Rb_tree_header) {
    uVar6 = 7;
    bVar15 = false;
    bVar14 = false;
    bVar13 = false;
    bVar9 = false;
    bVar5 = false;
    bVar12 = false;
  }
  else {
    bVar11 = false;
    bVar12 = false;
    bVar5 = false;
    bVar9 = false;
    bVar13 = false;
    bVar14 = false;
    bVar15 = false;
    local_a0 = info;
    do {
      local_a8.at_ = *(AtomType **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      local_98 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      local_90.at_ = local_a8.at_;
      local_88.at_ = local_a8.at_;
      local_80.at_ = local_a8.at_;
      local_78.at_ = local_a8.at_;
      local_70.at_ = local_a8.at_;
      local_68.at_ = local_a8.at_;
      bVar3 = DirectionalAdapter::isDirectional(&local_68);
      if (bVar3) {
        bVar11 = true;
      }
      bVar3 = MultipoleAdapter::isDipole(&local_a8);
      if (bVar3) {
        bVar14 = true;
      }
      bVar3 = MultipoleAdapter::isQuadrupole(&local_a8);
      if (bVar3) {
        bVar13 = true;
      }
      bVar3 = EAMAdapter::isEAM(&local_70);
      if ((bVar3) || (bVar3 = SuttonChenAdapter::isSuttonChen(&local_78), bVar3)) {
        bVar12 = true;
      }
      bVar3 = FixedChargeAdapter::isFixedCharge(&local_88);
      if (bVar3) {
        bVar15 = true;
      }
      bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_90);
      bVar4 = PolarizableAdapter::isPolarizable(&local_80);
      if (bVar3) {
        bVar5 = true;
      }
      if (bVar4) {
        bVar9 = true;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment(local_98);
    } while ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_60._M_impl.super__Rb_tree_header);
    uVar6 = 7;
    info = local_a0;
    if (bVar11) {
      uVar6 = 0x3f;
    }
  }
  uVar8 = 0;
  if (0 < iVar1) {
    uVar8 = 0x3f;
  }
  uVar7 = uVar6 + 0x400;
  if (!bVar14) {
    uVar7 = uVar6;
  }
  uVar6 = uVar7 + 0x800;
  if (!bVar13) {
    uVar6 = uVar7;
  }
  uVar7 = uVar6;
  if (bVar5) {
    uVar7 = uVar6 + 0x2000;
  }
  if (bVar15) {
    uVar7 = uVar6 + 0x2000;
  }
  uVar6 = uVar7 | 0x380;
  if (!bVar12) {
    uVar6 = uVar7;
  }
  uVar7 = uVar6 | 0x1000;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  if (bVar5) {
    uVar7 = (uVar7 & 6) << 0xe | uVar7 | 0x4000;
  }
  uVar6 = uVar7;
  if ((pGVar2->OutputParticlePotential).super_ParameterBase.field_0x2b != '\0') {
    uVar6 = uVar7 | 0x40;
  }
  if (((pGVar2->PrintHeatFlux).super_ParameterBase.empty_ == false) &&
     ((pGVar2->PrintHeatFlux).super_ParameterBase.field_0x2b != '\0')) {
    uVar6 = uVar7 | 0x40;
  }
  bVar12 = ((pGVar2->UniformField).super_ParameterBase.empty_ &
            (pGVar2->ElectricField).super_ParameterBase.empty_ &
            (pGVar2->UniformGradientStrength).super_ParameterBase.empty_ &
            (pGVar2->UniformGradientDirection1).super_ParameterBase.empty_ &
           (pGVar2->UniformGradientDirection2).super_ParameterBase.empty_) == 1;
  bVar9 = (pGVar2->OutputElectricField).super_ParameterBase.field_0x2b == '\0';
  bVar5 = (pGVar2->lightPars_->UseLight).super_ParameterBase.field_0x2b == '\0';
  uVar7 = uVar6;
  if ((!bVar12 || !bVar9) || !bVar5) {
    uVar7 = uVar6 | 0x1000;
  }
  uVar10 = uVar8 | 0x1000;
  if ((bVar12 && bVar9) && bVar5) {
    uVar10 = uVar8;
  }
  this_00 = pGVar2->rnemdPars_;
  if (((this_00->UseRNEMD).super_ParameterBase.empty_ == false) &&
     ((this_00->UseRNEMD).super_ParameterBase.field_0x2b == '\x01')) {
    bVar5 = RNEMD::RNEMDParameters::requiresElectricField(this_00);
    if (bVar5) {
      uVar10 = uVar10 | 0x1000;
      uVar7 = uVar6 | 0x1000;
    }
  }
  uVar6 = uVar10 | 0x20000;
  uVar8 = uVar7 | 0x20000;
  if ((pGVar2->OutputSitePotential).super_ParameterBase.field_0x2b == '\0') {
    uVar6 = uVar10;
    uVar8 = uVar7;
  }
  uVar7 = uVar8 | 0x1c000;
  if ((pGVar2->OutputFluctuatingCharges).super_ParameterBase.field_0x2b == '\0') {
    uVar7 = uVar8;
  }
  info->atomStorageLayout_ = uVar7;
  info->rigidBodyStorageLayout_ = uVar6;
  info->cutoffGroupStorageLayout_ = 1;
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void SimCreator::computeStorageLayouts(SimInfo* info) {
    Globals* simParams    = info->getSimParams();
    int nRigidBodies      = info->getNGlobalRigidBodies();
    AtomTypeSet atomTypes = info->getSimulatedAtomTypes();
    AtomTypeSet::iterator i;
    bool hasDirectionalAtoms     = false;
    bool hasFixedCharge          = false;
    bool hasDipoles              = false;
    bool hasQuadrupoles          = false;
    bool hasPolarizable          = false;
    bool hasFluctuatingCharge    = false;
    bool hasMetallic             = false;
    int atomStorageLayout        = 0;
    int rigidBodyStorageLayout   = 0;
    int cutoffGroupStorageLayout = 0;

    atomStorageLayout |= DataStorage::dslPosition;
    atomStorageLayout |= DataStorage::dslVelocity;
    atomStorageLayout |= DataStorage::dslForce;
    cutoffGroupStorageLayout |= DataStorage::dslPosition;

    for (i = atomTypes.begin(); i != atomTypes.end(); ++i) {
      DirectionalAdapter da        = DirectionalAdapter((*i));
      MultipoleAdapter ma          = MultipoleAdapter((*i));
      EAMAdapter ea                = EAMAdapter((*i));
      SuttonChenAdapter sca        = SuttonChenAdapter((*i));
      PolarizableAdapter pa        = PolarizableAdapter((*i));
      FixedChargeAdapter fca       = FixedChargeAdapter((*i));
      FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter((*i));

      if (da.isDirectional()) { hasDirectionalAtoms = true; }
      if (ma.isDipole()) { hasDipoles = true; }
      if (ma.isQuadrupole()) { hasQuadrupoles = true; }
      if (ea.isEAM() || sca.isSuttonChen()) { hasMetallic = true; }
      if (fca.isFixedCharge()) { hasFixedCharge = true; }
      if (fqa.isFluctuatingCharge()) { hasFluctuatingCharge = true; }
      if (pa.isPolarizable()) { hasPolarizable = true; }
    }

    if (nRigidBodies > 0) {
      rigidBodyStorageLayout |= DataStorage::dslPosition;
      rigidBodyStorageLayout |= DataStorage::dslVelocity;
      rigidBodyStorageLayout |= DataStorage::dslForce;
      rigidBodyStorageLayout |= DataStorage::dslAmat;
      rigidBodyStorageLayout |= DataStorage::dslAngularMomentum;
      rigidBodyStorageLayout |= DataStorage::dslTorque;
    }
    if (hasDirectionalAtoms) {
      atomStorageLayout |= DataStorage::dslAmat;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslAngularMomentum;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslTorque;
      }
    }
    if (hasDipoles) { atomStorageLayout |= DataStorage::dslDipole; }
    if (hasQuadrupoles) { atomStorageLayout |= DataStorage::dslQuadrupole; }
    if (hasFixedCharge || hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslSkippedCharge;
    }
    if (hasMetallic) {
      atomStorageLayout |= DataStorage::dslDensity;
      atomStorageLayout |= DataStorage::dslFunctional;
      atomStorageLayout |= DataStorage::dslFunctionalDerivative;
    }
    if (hasPolarizable) { atomStorageLayout |= DataStorage::dslElectricField; }
    if (hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslFlucQVelocity;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslFlucQForce;
      }
    }

    // if the user has asked for them, make sure we've got the memory for the
    // objects defined.

    if (simParams->getOutputParticlePotential()) {
      atomStorageLayout |= DataStorage::dslParticlePot;
    }

    if (simParams->havePrintHeatFlux()) {
      if (simParams->getPrintHeatFlux()) {
        atomStorageLayout |= DataStorage::dslParticlePot;
      }
    }

    if (simParams->getOutputElectricField() | simParams->haveElectricField() |
        simParams->haveUniformField() |
        simParams->haveUniformGradientStrength() |
        simParams->haveUniformGradientDirection1() |
        simParams->haveUniformGradientDirection2() |
        simParams->getLightParameters()->getUseLight()) {
      atomStorageLayout |= DataStorage::dslElectricField;
      rigidBodyStorageLayout |= DataStorage::dslElectricField;
    }

    if (simParams->getRNEMDParameters()->haveUseRNEMD()) {
      if (simParams->getRNEMDParameters()->getUseRNEMD()) {
        if (simParams->getRNEMDParameters()->requiresElectricField()) {
          atomStorageLayout |= DataStorage::dslElectricField;
          rigidBodyStorageLayout |= DataStorage::dslElectricField;
        }
      }
    }

    if (simParams->getOutputSitePotential()) {
      atomStorageLayout |= DataStorage::dslSitePotential;
      rigidBodyStorageLayout |= DataStorage::dslSitePotential;
    }

    if (simParams->getOutputFluctuatingCharges()) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      atomStorageLayout |= DataStorage::dslFlucQVelocity;
      atomStorageLayout |= DataStorage::dslFlucQForce;
    }

    info->setAtomStorageLayout(atomStorageLayout);
    info->setRigidBodyStorageLayout(rigidBodyStorageLayout);
    info->setCutoffGroupStorageLayout(cutoffGroupStorageLayout);

    return;
  }